

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

BasicHeapType __thiscall wasm::HeapType::getUnsharedTop(HeapType *this)

{
  BasicHeapType BVar1;
  HeapType *this_local;
  
  BVar1 = getUnsharedBottom(this);
  switch(BVar1) {
  case ext:
  case func:
  case cont:
  case any:
  case eq:
  case i31:
  case struct_:
  case array:
  case exn:
  case string:
  default:
    handle_unreachable("unexpected type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                       ,0x472);
  case none:
    this_local._4_4_ = any;
    break;
  case noext:
    this_local._4_4_ = ext;
    break;
  case nofunc:
    this_local._4_4_ = func;
    break;
  case nocont:
    this_local._4_4_ = cont;
    break;
  case noexn:
    this_local._4_4_ = exn;
  }
  return this_local._4_4_;
}

Assistant:

HeapType::BasicHeapType HeapType::getUnsharedTop() const {
  switch (getUnsharedBottom()) {
    case none:
      return any;
    case nofunc:
      return func;
    case nocont:
      return cont;
    case noext:
      return ext;
    case noexn:
      return exn;
    case ext:
    case func:
    case cont:
    case any:
    case eq:
    case i31:
    case struct_:
    case array:
    case exn:
    case string:
      break;
  }
  WASM_UNREACHABLE("unexpected type");
}